

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

IRC_Bot * __thiscall ServerManager::getServer(ServerManager *this,string_view serverConfig)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  reference this_00;
  pointer pIVar2;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *server;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
  *__range1;
  ServerManager *this_local;
  string_view serverConfig_local;
  
  __end1 = std::
           vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ::begin(&this->m_servers);
  server = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
           std::
           vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ::end(&this->m_servers);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                                *)&server);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (IRC_Bot *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
              ::operator*(&__end1);
    std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::operator->(this_00);
    lhs = (basic_string_view<char,_std::char_traits<char>_>)Jupiter::IRC::Client::getConfigSection()
    ;
    bVar1 = jessilib::equalsi<char,char>(lhs,serverConfig);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
    ::operator++(&__end1);
  }
  pIVar2 = std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::get(this_00);
  return pIVar2;
}

Assistant:

IRC_Bot *ServerManager::getServer(std::string_view serverConfig) {
	for (const auto& server : m_servers) {
		if (jessilib::equalsi(server->getConfigSection(), serverConfig)) {
			return server.get();
		}
	}

	return nullptr;
}